

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O3

void expr_ff(t_expr *x)

{
  int iVar1;
  _exprproxy *x_00;
  long lVar2;
  
  x_00 = x->exp_proxy;
  while (x_00 != (_exprproxy *)0x0) {
    x->exp_proxy = x_00->p_next;
    pd_free(&x_00->p_pd);
    x_00 = x->exp_proxy;
  }
  iVar1 = x->exp_nexpr;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (x->exp_stack[lVar2] != (ex_ex *)0x0) {
        free(x->exp_stack[lVar2]);
        iVar1 = x->exp_nexpr;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  lVar2 = -100;
  do {
    if (x->exp_p_res[lVar2] != (t_float *)0x0) {
      free(x->exp_p_res[lVar2]);
    }
    if (x->exp_tmpres[lVar2] != (t_float *)0x0) {
      free(x->exp_tmpres[lVar2]);
    }
    if (*(void **)(&x->exp_vsize + lVar2 * 2) != (void *)0x0) {
      free(*(void **)(&x->exp_vsize + lVar2 * 2));
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

static void
expr_ff(t_expr *x)
{
        t_exprproxy *y;
        int i;

        y = x->exp_proxy;
        while (y)
        {
                x->exp_proxy = y->p_next;
#ifdef PD
                pd_free(&y->p_pd);
#else /*MSP */
        /* SDY find out what needs to be called for MSP */

#endif
                y = x->exp_proxy;
        }
        for (i = 0 ; i < x->exp_nexpr; i++)
                if (x->exp_stack[i])
                        fts_free(x->exp_stack[i]);
/*
 * SDY free all the allocated buffers here for expr~ and fexpr~
 * check to see if there are others
 */
        for (i = 0; i < MAX_VARS; i++) {
                if (x->exp_p_var[i])
                        fts_free(x->exp_p_var[i]);
                if (x->exp_p_res[i])
                        fts_free(x->exp_p_res[i]);
                if (x->exp_tmpres[i])
                        fts_free(x->exp_tmpres[i]);
        }


}